

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.cpp
# Opt level: O1

bool __thiscall cornelich::region::position(region *this,int32_t position)

{
  bool bVar1;
  
  bVar1 = position <= this->m_limit_offset;
  if (-1 < position && bVar1) {
    (this->m_position_offset).super___atomic_base<int>._M_i = position + this->m_start_offset;
  }
  return -1 < position && bVar1;
}

Assistant:

bool region::position(std::int32_t position)
{
    if(BOOST_UNLIKELY(position > m_limit_offset || position < 0))
        return false;
    m_position_offset.store(m_start_offset + position, std::memory_order_relaxed);
    return true;
}